

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  long lVar1;
  int iVar2;
  appender aVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char cVar7;
  int size;
  ulong size_00;
  int num_digits;
  char digits [40];
  int local_80;
  uint local_7c;
  anon_class_32_4_dca7119b local_78;
  char local_58 [40];
  
  lVar1 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  size = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar1] -
         (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                  (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar1] * 8)
               );
  local_80 = size;
  local_7c = prefix;
  format_decimal<char,unsigned_long>(local_58,value,size);
  if ((grouping->sep_).thousands_sep != '\0') {
    pcVar5 = (grouping->sep_).grouping._M_dataplus._M_p;
    pcVar4 = pcVar5 + (grouping->sep_).grouping._M_string_length;
    iVar2 = 0;
    iVar6 = 0;
    do {
      if (pcVar5 == pcVar4) {
        cVar7 = pcVar4[-1];
        pcVar5 = pcVar4;
      }
      else {
        cVar7 = *pcVar5;
        if ((byte)(cVar7 + 0x81U) < 0x82) goto LAB_0012039a;
        pcVar5 = pcVar5 + 1;
      }
      iVar6 = iVar6 + cVar7;
      if (size <= iVar6) goto LAB_0012039a;
      iVar2 = iVar2 + 1;
    } while( true );
  }
  iVar2 = 0;
LAB_0012039a:
  size_00 = (ulong)(((size + 1) - (uint)(prefix == 0)) + iVar2);
  local_78.prefix = &local_7c;
  local_78.num_digits = &local_80;
  local_78.grouping = grouping;
  local_78.digits = &local_58;
  aVar3 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::digit_grouping<char>const&)::_lambda(fmt::v8::appender)_1_>
                    (out,specs,size_00,size_00,&local_78);
  return (appender)aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}